

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_npn_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  _func_int_SSL_ptr_uint8_t_ptr_ptr_uint_ptr_void_ptr *p_Var1;
  uint8_t *puVar2;
  int iVar3;
  pointer psVar4;
  undefined1 local_68 [8];
  CBB contents;
  uint8_t *puStack_30;
  uint npa_len;
  uint8_t *npa;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  npa = (uint8_t *)hs->ssl;
  if ((*(uint *)&hs->field_0x6c8 >> 0xf & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    ssl = (SSL *)out;
    out_local = (CBB *)hs;
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&((SSL *)npa)->ctx);
    puVar2 = npa;
    p_Var1 = psVar4->next_protos_advertised_cb;
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(npa + 0x68));
    iVar3 = (*p_Var1)((SSL *)puVar2,&stack0xffffffffffffffd0,(uint *)((long)&contents.u + 0x1c),
                      psVar4->next_protos_advertised_cb_arg);
    if (iVar3 == 0) {
      iVar3 = CBB_add_u16((CBB *)ssl,0x3374);
      if ((((iVar3 != 0) &&
           (iVar3 = CBB_add_u16_length_prefixed((CBB *)ssl,(CBB *)local_68), iVar3 != 0)) &&
          (iVar3 = CBB_add_bytes((CBB *)local_68,puStack_30,(ulong)(uint)contents.u._28_4_),
          iVar3 != 0)) && (iVar3 = CBB_flush((CBB *)ssl), iVar3 != 0)) {
        return true;
      }
      hs_local._7_1_ = false;
    }
    else {
      *(uint *)&out_local[0x24].is_child = *(uint *)&out_local[0x24].is_child & 0xffff7fff;
      hs_local._7_1_ = true;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_npn_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  // |next_proto_neg_seen| might have been cleared when an ALPN extension was
  // parsed.
  if (!hs->next_proto_neg_seen) {
    return true;
  }

  const uint8_t *npa;
  unsigned npa_len;

  if (ssl->ctx->next_protos_advertised_cb(
          ssl, &npa, &npa_len, ssl->ctx->next_protos_advertised_cb_arg) !=
      SSL_TLSEXT_ERR_OK) {
    hs->next_proto_neg_seen = false;
    return true;
  }

  CBB contents;
  if (!CBB_add_u16(out, TLSEXT_TYPE_next_proto_neg) ||  //
      !CBB_add_u16_length_prefixed(out, &contents) ||   //
      !CBB_add_bytes(&contents, npa, npa_len) ||        //
      !CBB_flush(out)) {
    return false;
  }

  return true;
}